

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_wallmarks.cxx
# Opt level: O0

void __thiscall write_wm_data::operator()(write_wm_data *this,wm_data *wm,xr_writer *w)

{
  size_type value;
  xr_writer *w_local;
  wm_data *wm_local;
  write_wm_data *this_local;
  
  xray_re::xr_writer::w_fvector3(w,(fvector3 *)wm);
  xray_re::xr_writer::w_float(w,(wm->bounds).r);
  value = std::vector<xray_re::wm_vertex,_std::allocator<xray_re::wm_vertex>_>::size(&wm->vertices);
  xray_re::xr_writer::w_size_u32(w,value);
  xray_re::xr_writer::w_seq<std::vector<xray_re::wm_vertex,std::allocator<xray_re::wm_vertex>>>
            (w,&wm->vertices);
  return;
}

Assistant:

void operator()(const wm_data& wm, xr_writer& w) const {
	w.w_fvector3(wm.bounds.p);
	w.w_float(wm.bounds.r);
	w.w_size_u32(wm.vertices.size());
	w.w_seq(wm.vertices);
}